

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint __thiscall
wabt::LocalTypes::size::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Index sum,Decl *decl)

{
  Decl *decl_local;
  Index sum_local;
  anon_class_1_0_00000001 *this_local;
  
  return sum + decl->second;
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl : decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}